

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O3

unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::operator->
          (JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8> *this)

{
  char cVar1;
  _func_int *p_Var2;
  _Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false> in_RDX;
  TimedInterruptSource *extraout_RDX;
  _func_int **in_RSI;
  unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
  uVar3;
  
  LOCK();
  cVar1 = *(char *)(in_RSI + 0xc);
  *(char *)(in_RSI + 0xc) = '\x01';
  UNLOCK();
  if (cVar1 == '\0') {
    if (*(char *)(in_RSI + 0xb) == '\0') {
      *(undefined2 *)(in_RSI + 0xb) = 0x101;
      p_Var2 = in_RSI[8];
      in_RSI[8] = (_func_int *)((long)p_Var2 % 0x10);
      if (0xf < (long)p_Var2) {
        Enterprise::Dave::TimedInterruptSource::run_for
                  ((TimedInterruptSource *)(in_RSI + 1),(Cycles)((ulong)p_Var2 >> 4));
        in_RDX._M_head_impl = extraout_RDX;
      }
    }
    LOCK();
    *(undefined1 *)(in_RSI + 0xc) = 0;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = in_RSI;
    (this->object_).global_divider_.super_WrappedInt<Cycles>.length_ = (IntType)(in_RSI + 1);
    uVar3._M_t.
    super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Enterprise::Dave::TimedInterruptSource_*,_false>._M_head_impl =
         in_RDX._M_head_impl;
    uVar3._M_t.
    super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
            )uVar3._M_t.
             super___uniq_ptr_impl<Enterprise::Dave::TimedInterruptSource,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_Enterprise::Dave::TimedInterruptSource_*,_JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Enterprise::Dave::TimedInterruptSource, HalfCycles, 1, 8>::operator->() [T = Enterprise::Dave::TimedInterruptSource, LocalTimeScale = HalfCycles, multiplier = 1, divider = 8]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}